

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

void __thiscall smf::MidiEventList::MidiEventList(MidiEventList *this,MidiEventList *other)

{
  size_type sVar1;
  back_insert_iterator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_> __first;
  MidiEvent **local_30;
  const_iterator it;
  MidiEventList *other_local;
  MidiEventList *this_local;
  
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::vector(&this->list);
  sVar1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(&other->list);
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve(&this->list,sVar1);
  local_30 = (MidiEvent **)
             std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::begin(&other->list);
  __first = std::back_inserter<std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>>
                      (&this->list);
  sVar1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(&other->list);
  std::
  generate_n<std::back_insert_iterator<std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>>,unsigned_long,smf::MidiEventList::MidiEventList(smf::MidiEventList_const&)::__0>
            (__first,sVar1,(const_iterator *)&local_30);
  return;
}

Assistant:

MidiEventList::MidiEventList(const MidiEventList& other) {
	list.reserve(other.list.size());
	auto it = other.list.begin();
	std::generate_n(std::back_inserter(list), other.list.size(), [&]() -> MidiEvent* {
		return new MidiEvent(**it++);
	});
}